

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O1

bool __thiscall
AI::Condition::isTrue
          (Condition *this,WorldState *state,Task *task,
          vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
          *satisfiablePredicates,bool isMerged)

{
  float fVar1;
  ConsumableFact CVar2;
  SatisfiablePredicateIdentifier SVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pCVar6;
  pointer pSVar7;
  pointer pSVar8;
  undefined1 *puVar9;
  Condition *pCVar10;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *pvVar11;
  bool bVar12;
  _Base_ptr p_Var13;
  pointer pSVar14;
  pointer pSVar15;
  pointer pCVar16;
  _Base_ptr p_Var17;
  _Rb_tree_header *p_Var18;
  pointer pSVar19;
  long lVar20;
  RequiredValue *requiredValue;
  pointer pRVar21;
  _Rb_tree_header *p_Var22;
  RequiredFlag *requiredFlag;
  pointer pRVar23;
  bool bVar24;
  int local_4c;
  Condition *local_48;
  vector<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_> *local_40;
  Task *local_38;
  
  pRVar23 = (this->requiredFlags).
            super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar4 = (this->requiredFlags).
           super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar24 = pRVar23 == pRVar4;
  local_48 = this;
  local_40 = satisfiablePredicates;
  local_38 = task;
  if (!bVar24) {
    p_Var18 = &(state->current).flags._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var17 = (state->current).flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var13 = &p_Var18->_M_header;
      if (p_Var17 != (_Base_ptr)0x0) {
        do {
          if ((int)pRVar23->id <= (int)*(size_t *)(p_Var17 + 1)) {
            p_Var13 = p_Var17;
          }
          p_Var17 = (&p_Var17->_M_left)[(int)*(size_t *)(p_Var17 + 1) < (int)pRVar23->id];
        } while (p_Var17 != (_Base_ptr)0x0);
      }
      p_Var22 = p_Var18;
      if (((_Rb_tree_header *)p_Var13 != p_Var18) &&
         (p_Var22 = (_Rb_tree_header *)p_Var13,
         (int)pRVar23->id < (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
        p_Var22 = p_Var18;
      }
      if (p_Var22 == p_Var18) {
        log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
      }
      if ((bool)*(undefined1 *)((long)&p_Var22->_M_node_count + 4) != pRVar23->flag) {
        if (!bVar24) {
          return false;
        }
        break;
      }
      pRVar23 = pRVar23 + 1;
      bVar24 = pRVar23 == pRVar4;
    } while (!bVar24);
  }
  pRVar21 = (local_48->requiredValues).
            super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar5 = (local_48->requiredValues).
           super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar24 = pRVar21 == pRVar5;
  if (!bVar24) {
    p_Var18 = &(state->current).values._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var17 = (state->current).values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var13 = &p_Var18->_M_header;
      if (p_Var17 != (_Base_ptr)0x0) {
        do {
          if ((int)pRVar21->id <= (int)*(size_t *)(p_Var17 + 1)) {
            p_Var13 = p_Var17;
          }
          p_Var17 = (&p_Var17->_M_left)[(int)*(size_t *)(p_Var17 + 1) < (int)pRVar21->id];
        } while (p_Var17 != (_Base_ptr)0x0);
      }
      p_Var22 = p_Var18;
      if (((_Rb_tree_header *)p_Var13 != p_Var18) &&
         (p_Var22 = (_Rb_tree_header *)p_Var13,
         (int)pRVar21->id < (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
        p_Var22 = p_Var18;
      }
      if (p_Var22 == p_Var18) {
        log<char_const*,char_const*>("[Condition] ","ERROR: flag missing");
      }
      switch(pRVar21->op) {
      case LessThan:
        if (pRVar21->value <= *(float *)((long)&p_Var22->_M_node_count + 4)) {
LAB_0011fff3:
          if (!bVar24) {
            return false;
          }
          goto LAB_0011fffd;
        }
        break;
      case LessEqual:
        fVar1 = *(float *)((long)&p_Var22->_M_node_count + 4);
        if (pRVar21->value <= fVar1 && fVar1 != pRVar21->value) goto LAB_0011fff3;
        break;
      case EqualTo:
        fVar1 = *(float *)((long)&p_Var22->_M_node_count + 4);
        if ((fVar1 != pRVar21->value) || (NAN(fVar1) || NAN(pRVar21->value))) goto LAB_0011fff3;
        break;
      case NotEqualTo:
        fVar1 = *(float *)((long)&p_Var22->_M_node_count + 4);
        if ((fVar1 == pRVar21->value) && (!NAN(fVar1) && !NAN(pRVar21->value))) goto LAB_0011fff3;
        break;
      case GreaterThan:
        if (*(float *)((long)&p_Var22->_M_node_count + 4) <= pRVar21->value) goto LAB_0011fff3;
        break;
      case GreaterEqual:
        puVar9 = (undefined1 *)((long)&p_Var22->_M_node_count + 4);
        if (*(float *)puVar9 <= pRVar21->value && pRVar21->value != *(float *)puVar9)
        goto LAB_0011fff3;
      }
      pRVar21 = pRVar21 + 1;
      bVar24 = pRVar21 == pRVar5;
    } while (!bVar24);
  }
LAB_0011fffd:
  pvVar11 = local_40;
  pCVar10 = local_48;
  if (!isMerged) {
    pSVar7 = (local_48->satisfiedPredicates).
             super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar19 = (local_48->satisfiedPredicates).
                   super__Vector_base<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                   ._M_impl.super__Vector_impl_data._M_start; bVar24 = pSVar19 != pSVar7, bVar24;
        pSVar19 = pSVar19 + 1) {
      SVar3 = pSVar19->identifier;
      pSVar15 = (pvVar11->
                super__Vector_base<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar8 = (pvVar11->
               super__Vector_base<AI::SatisfiablePredicate,_std::allocator<AI::SatisfiablePredicate>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar20 = ((long)pSVar8 - (long)pSVar15 >> 3) * -0x3333333333333333 >> 2;
      pSVar14 = pSVar15;
      if (0 < lVar20) {
        pSVar14 = pSVar15 + lVar20 * 4;
        lVar20 = lVar20 + 1;
        pSVar15 = pSVar15 + 2;
        do {
          if (pSVar15[-2].identifier == SVar3) {
            pSVar15 = pSVar15 + -2;
            goto LAB_00120157;
          }
          if (pSVar15[-1].identifier == SVar3) {
            pSVar15 = pSVar15 + -1;
            goto LAB_00120157;
          }
          if (pSVar15->identifier == SVar3) goto LAB_00120157;
          if (pSVar15[1].identifier == SVar3) {
            pSVar15 = pSVar15 + 1;
            goto LAB_00120157;
          }
          lVar20 = lVar20 + -1;
          pSVar15 = pSVar15 + 4;
        } while (1 < lVar20);
      }
      lVar20 = ((long)pSVar8 - (long)pSVar14 >> 3) * -0x3333333333333333;
      if (lVar20 == 1) {
LAB_0012013a:
        pSVar15 = pSVar14;
        if (pSVar14->identifier != SVar3) {
          pSVar15 = pSVar8;
        }
      }
      else if (lVar20 == 2) {
LAB_00120132:
        pSVar15 = pSVar14;
        if (pSVar14->identifier != SVar3) {
          pSVar14 = pSVar14 + 1;
          goto LAB_0012013a;
        }
      }
      else {
        pSVar15 = pSVar8;
        if ((lVar20 == 3) && (pSVar15 = pSVar14, pSVar14->identifier != SVar3)) {
          pSVar14 = pSVar14 + 1;
          goto LAB_00120132;
        }
      }
LAB_00120157:
      local_4c = pSVar19->index;
      if ((pSVar15->func).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar12 = (*(pSVar15->func)._M_invoker)((_Any_data *)&pSVar15->func,state,local_38,&local_4c);
      if (!bVar12) {
        if (bVar24) {
          return false;
        }
        break;
      }
    }
  }
  pCVar16 = (pCVar10->consumableFlags).
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar6 = (pCVar10->consumableFlags).
           super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar24 = pCVar16 == pCVar6;
  if (!bVar24) {
    p_Var18 = &(state->facts).flags._M_t._M_impl.super__Rb_tree_header;
    do {
      CVar2 = *pCVar16;
      p_Var17 = (state->facts).flags._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var13 = &p_Var18->_M_header;
      for (; p_Var17 != (_Base_ptr)0x0;
          p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < (int)CVar2]) {
        if ((int)CVar2 <= (int)p_Var17[1]._M_color) {
          p_Var13 = p_Var17;
        }
      }
      p_Var17 = &p_Var18->_M_header;
      if (((_Rb_tree_header *)p_Var13 != p_Var18) &&
         (p_Var17 = p_Var13, (int)CVar2 < (int)p_Var13[1]._M_color)) {
        p_Var17 = &p_Var18->_M_header;
      }
      if (p_Var17[1].field_0x5 == '\x01') {
        if (!bVar24) {
          return false;
        }
        break;
      }
      pCVar16 = pCVar16 + 1;
      bVar24 = pCVar16 == pCVar6;
    } while (!bVar24);
  }
  pCVar16 = (pCVar10->consumableValues).
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar6 = (pCVar10->consumableValues).
           super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar24 = pCVar16 == pCVar6;
  if (!bVar24) {
    p_Var18 = &(state->facts).values._M_t._M_impl.super__Rb_tree_header;
    do {
      CVar2 = *pCVar16;
      p_Var17 = (state->facts).values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var13 = &p_Var18->_M_header;
      for (; p_Var17 != (_Base_ptr)0x0;
          p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < (int)CVar2]) {
        if ((int)CVar2 <= (int)p_Var17[1]._M_color) {
          p_Var13 = p_Var17;
        }
      }
      p_Var17 = &p_Var18->_M_header;
      if (((_Rb_tree_header *)p_Var13 != p_Var18) &&
         (p_Var17 = p_Var13, (int)CVar2 < (int)p_Var13[1]._M_color)) {
        p_Var17 = &p_Var18->_M_header;
      }
      if (*(char *)&p_Var17[1]._M_parent == '\x01') {
        if (!bVar24) {
          return false;
        }
        break;
      }
      pCVar16 = pCVar16 + 1;
      bVar24 = pCVar16 == pCVar6;
    } while (!bVar24);
  }
  pCVar16 = (pCVar10->consumableVectors).
            super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar6 = (pCVar10->consumableVectors).
           super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar24 = pCVar16 == pCVar6;
  if (!bVar24) {
    p_Var18 = &(state->facts).vectors._M_t._M_impl.super__Rb_tree_header;
    do {
      CVar2 = *pCVar16;
      p_Var17 = (state->facts).vectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var13 = &p_Var18->_M_header;
      for (; p_Var17 != (_Base_ptr)0x0;
          p_Var17 = (&p_Var17->_M_left)[(int)p_Var17[1]._M_color < (int)CVar2]) {
        if ((int)CVar2 <= (int)p_Var17[1]._M_color) {
          p_Var13 = p_Var17;
        }
      }
      p_Var17 = &p_Var18->_M_header;
      if (((_Rb_tree_header *)p_Var13 != p_Var18) &&
         (p_Var17 = p_Var13, (int)CVar2 < (int)p_Var13[1]._M_color)) {
        p_Var17 = &p_Var18->_M_header;
      }
      if (*(char *)&p_Var17[1]._M_left == '\x01') {
        return bVar24;
      }
      pCVar16 = pCVar16 + 1;
      bVar24 = pCVar16 == pCVar6;
    } while (!bVar24);
  }
  return bVar24;
}

Assistant:

bool Condition::isTrue(const WorldState& state, const Task& task, const std::vector<SatisfiablePredicate>& satisfiablePredicates, bool isMerged)
	{
		for (auto& requiredFlag : requiredFlags)
		{
			auto it = state.current.flags.find(requiredFlag.id);

			if (it == end(state.current.flags))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			if (it->second != requiredFlag.flag)
				return false;
		}

		for (auto& requiredValue : requiredValues)
		{
			auto it = state.current.values.find(requiredValue.id);

			if (it == end(state.current.values))
			{
				log("[Condition] ", "ERROR: flag missing");
			}

			switch (requiredValue.op)
			{
				case ConditionOp::LessThan
					:
				{					
					if (it->second >= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::LessEqual
					:
				{					
					if (it->second > requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::EqualTo
					:
				{					
					if (it->second != requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::NotEqualTo
					:
				{
					if (it->second == requiredValue.value)
						return false;
					break;
				}
				case ConditionOp::GreaterThan
					:
				{					
					if (it->second <= requiredValue.value)
						return false;

					break;
				}
				case ConditionOp::GreaterEqual
					:
				{					
					if (it->second < requiredValue.value)
						return false;

					break;
				}				
			}
		}		

		if (!isMerged)
		{
			for (auto satisfiable : satisfiedPredicates)
			{			
				const auto& pred = std::find_if(begin(satisfiablePredicates), end(satisfiablePredicates), 
					[satisfiable](const auto& sp) {return sp.identifier == satisfiable.identifier;});
				
				if (!pred->func(state, task, satisfiable.index))
				{
					return false;
				}
			}
		}

		for (auto consumable : consumableFlags)
		{
			auto it = state.facts.flags.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableValues)
		{
			auto it = state.facts.values.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		for (auto consumable : consumableVectors)
		{
			auto it = state.facts.vectors.find(consumable);

			if (it->second.consumed)
			{
				return false;
			}
		}

		return true;
	}